

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O1

void EpdAdd3(EpDouble *epd1,EpDouble *epd2,EpDouble *epd3)

{
  double dVar1;
  int __exponent;
  int iVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  EpTypeUnion EVar6;
  
  if ((0xffe < SUB84(epd1->type,4) >> 0x14 &&
       ((ulong)epd1->type & 0xfffffffffffff) == 0x8000000000000) ||
     (((ulong)epd2->type & 0xfffffffffffff) == 0x8000000000000 &&
      0xffefffffffffffff < (ulong)epd2->type)) goto LAB_008107cb;
  EVar6 = epd1->type;
  uVar4 = (ulong)EVar6 & 0x7fffffffffffffff;
  if (uVar4 == 0x7ff0000000000000) {
LAB_00810795:
    if (((ulong)epd2->type & 0x7fffffffffffffff) == 0x7ff0000000000000) {
      if ((long)((ulong)epd2->type ^ (ulong)epd1->type) < 0) {
LAB_008107cb:
        (epd3->type).value = -NAN;
        epd3->exponent = 0;
        return;
      }
      EVar6 = epd1->type;
    }
    else if (uVar4 != 0x7ff0000000000000) goto LAB_008107a2;
    epd3->type = EVar6;
    iVar2 = epd1->exponent;
  }
  else {
    if (((ulong)epd2->type & 0x7fffffffffffffff) != 0x7ff0000000000000) {
      if (((ulong)epd1->type & 0x7ff0000000000000) != 0x3ff0000000000000) {
        __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                      ,0x2ad,"void EpdAdd3(EpDouble *, EpDouble *, EpDouble *)");
      }
      if (((ulong)epd2->type & 0x7ff0000000000000) != 0x3ff0000000000000) {
        __assert_fail("epd2->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                      ,0x2ae,"void EpdAdd3(EpDouble *, EpDouble *, EpDouble *)");
      }
      iVar3 = epd1->exponent;
      iVar2 = epd2->exponent;
      __exponent = iVar3 - iVar2;
      if (__exponent == 0 || iVar3 < iVar2) {
        if (iVar3 < iVar2) {
          if (iVar2 - iVar3 < 0x400) {
            dVar1 = (epd1->type).value;
            dVar5 = ldexp(1.0,iVar2 - iVar3);
            EVar6.value = dVar1 / dVar5 + (epd2->type).value;
          }
          else {
            EVar6 = epd2->type;
          }
          iVar3 = epd2->exponent;
        }
        else {
          EVar6.value = (epd1->type).value + (epd2->type).value;
        }
      }
      else {
        EVar6 = (EpTypeUnion)(epd1->type).value;
        if (__exponent < 0x400) {
          dVar1 = (epd2->type).value;
          dVar5 = ldexp(1.0,__exponent);
          EVar6.value = EVar6.value + dVar1 / dVar5;
        }
        iVar3 = epd1->exponent;
      }
      (epd3->type).value = (double)EVar6;
      epd3->exponent = iVar3;
      EpdNormalize(epd3);
      return;
    }
    if (uVar4 == 0x7ff0000000000000) goto LAB_00810795;
LAB_008107a2:
    epd3->type = epd2->type;
    iVar2 = epd2->exponent;
  }
  epd3->exponent = iVar2;
  return;
}

Assistant:

void
EpdAdd3(EpDouble *epd1, EpDouble *epd2, EpDouble *epd3)
{
  double        value;
  int           exponent, diff;

  if (EpdIsNan(epd1) || EpdIsNan(epd2)) {
    EpdMakeNan(epd3);
    return;
  } else if (EpdIsInf(epd1) || EpdIsInf(epd2)) {
    int sign;

    if (EpdIsInf(epd1) && EpdIsInf(epd2)) {
      sign = epd1->type.bits.sign ^ epd2->type.bits.sign;
      if (sign == 1)
        EpdMakeNan(epd3);
      else
        EpdCopy(epd1, epd3);
    } else if (EpdIsInf(epd1)) {
      EpdCopy(epd1, epd3);
    } else {
      EpdCopy(epd2, epd3);
    }
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);
  assert(epd2->type.bits.exponent == EPD_MAX_BIN);

  if (epd1->exponent > epd2->exponent) {
    diff = epd1->exponent - epd2->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value +
                epd2->type.value / pow((double)2.0, (double)diff);
    } else
      value = epd1->type.value;
    exponent = epd1->exponent;
  } else if (epd1->exponent < epd2->exponent) {
    diff = epd2->exponent - epd1->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value / pow((double)2.0, (double)diff) +
                epd2->type.value;
    } else
      value = epd2->type.value;
    exponent = epd2->exponent;
  } else {
    value = epd1->type.value + epd2->type.value;
    exponent = epd1->exponent;
  }
  epd3->type.value = value;
  epd3->exponent = exponent;
  EpdNormalize(epd3);
}